

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O0

u8 __thiscall GB::Read(GB *this,u16 addr)

{
  bool bVar1;
  byte bStack_19;
  u16 addr_local;
  GB *this_local;
  
  switch(addr >> 0xc) {
  case 0:
  case 1:
  case 2:
  case 3:
    this_local._7_1_ = (this->s).rom0p[(int)(addr & 0x3fff)];
    break;
  case 4:
  case 5:
  case 6:
  case 7:
    this_local._7_1_ = (this->s).rom1p[(int)(addr & 0x3fff)];
    break;
  case 8:
  case 9:
    bVar1 = using_vram(this);
    if (bVar1) {
      this_local._7_1_ = 0xff;
    }
    else {
      this_local._7_1_ = (this->s).vramp[(int)(addr & 0x1fff)];
    }
    break;
  case 10:
  case 0xb:
    if (((this->s).sram_enabled & 1U) == 0) {
      this_local._7_1_ = 0xff;
    }
    else {
      this_local._7_1_ = (this->s).sramp[(int)((addr & (this->cart).sram_addr_mask) & 0x1fff)];
    }
    break;
  case 0xc:
  case 0xe:
    this_local._7_1_ = (this->s).wram0p[(int)(addr & 0xfff)];
    break;
  case 0xd:
    this_local._7_1_ = (this->s).wram1p[(int)(addr & 0xfff)];
    break;
  case 0xf:
    bStack_19 = (byte)(addr >> 8);
    if ((bStack_19 & 0xf) == 0xe) {
      bVar1 = using_oam(this);
      if (bVar1) {
        this_local._7_1_ = 0xff;
      }
      else {
        this_local._7_1_ = (this->s).oam[(int)(addr & 0xff)];
      }
    }
    else if ((bStack_19 & 0xf) == 0xf) {
      this_local._7_1_ = (this->s).io[(int)(addr & 0xff)];
    }
    else {
      this_local._7_1_ = (this->s).wram1p[(int)(addr & 0xfff)];
    }
    break;
  default:
    this_local._7_1_ = 0xff;
  }
  return this_local._7_1_;
}

Assistant:

u8 GB::Read(u16 addr) {
  switch (addr >> 12) {
    case 0: case 1: case 2: case 3: return s.rom0p[addr & 0x3fff];
    case 4: case 5: case 6: case 7: return s.rom1p[addr & 0x3fff];
    case 8: case 9: return using_vram() ? 0xff : s.vramp[addr & 0x1fff];
    case 10: case 11:
      return s.sram_enabled ? s.sramp[addr & cart.sram_addr_mask & 0x1fff]
                            : 0xff;
    case 12: case 14: return s.wram0p[addr & 0xfff];
    case 13: return s.wram1p[addr & 0xfff];
    case 15:
      switch ((addr >> 8) & 0xf) {
        default: return s.wram1p[addr & 0xfff];
        case 14: return using_oam() ? 0xff : s.oam[addr & 0xff];
        case 15: return s.io[addr & 0xff];
      }
  }
  return 0xff;
}